

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

void __thiscall Imf_2_5::StdIFStream::StdIFStream(StdIFStream *this,char *fileName)

{
  byte bVar1;
  ifstream *piVar2;
  IStream *in_RSI;
  undefined8 *in_RDI;
  char *filename;
  char *in_stack_ffffffffffffffe8;
  
  IStream::IStream(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__StdIFStream_00562478;
  filename = (char *)(in_RDI + 5);
  piVar2 = anon_unknown_2::make_ifstream(filename);
  *(ifstream **)filename = piVar2;
  *(undefined1 *)(in_RDI + 6) = 1;
  bVar1 = std::ios::operator!((ios *)((long)in_RDI[5] + *(long *)(*(long *)in_RDI[5] + -0x18)));
  if ((bVar1 & 1) != 0) {
    if ((long *)in_RDI[5] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[5] + 8))();
    }
    Iex_2_5::throwErrnoExc();
  }
  return;
}

Assistant:

StdIFStream::StdIFStream (const char fileName[]):
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream (fileName),
    _is (make_ifstream (fileName)),
    _deleteStream (true)
{
    if (!*_is)
    {
	delete _is;
	IEX_NAMESPACE::throwErrnoExc();
    }
}